

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O1

bool __thiscall Regex::parse(Regex *this,string *string)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  ParseData data;
  ParseData local_58;
  
  bVar3 = true;
  if (this->mState - STATE_PREPARED < 2) {
    paVar1 = &local_58.string.field_2;
    pcVar2 = (string->_M_dataplus)._M_p;
    local_58.string._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_58,pcVar2,pcVar2 + string->_M_string_length);
    local_58.cur_pos = 0;
    local_58.backtrack_pos = 0;
    local_58.match_count = 0;
    bVar3 = processSubTree(this,&this->mRoot,&local_58);
    if (bVar3) {
      this->mState = STATE_PARSED;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.string._M_dataplus._M_p != paVar1) {
      operator_delete(local_58.string._M_dataplus._M_p,
                      local_58.string.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar3;
}

Assistant:

bool	Regex::parse( const JHSTD::string &string )
{	
	if ( mState != Regex::STATE_PARSED && mState != Regex::STATE_PREPARED )
		return JetHead::kNotInitialized;
	
	Element *cur_node = &mRoot;
	ParseData data( string );
	
	bool res = processSubTree( cur_node, &data );

	if ( res )
		mState = Regex::STATE_PARSED;

	return res;
}